

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_OnChangedClipRect(ImDrawList *this)

{
  int iVar1;
  ImDrawCmd *pIVar2;
  ImVector<ImDrawCmd> *in_RDI;
  ImDrawCmd *prev_cmd;
  ImDrawCmd *curr_cmd;
  
  pIVar2 = in_RDI->Data + (in_RDI->Size + -1);
  if ((pIVar2->ElemCount == 0) || (pIVar2->ClipRect == *(ImVec4 *)&in_RDI[8].Data)) {
    if (pIVar2->UserCallback != (ImDrawCallback)0x0) {
      __assert_fail("curr_cmd->UserCallback == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x1ef,"void ImDrawList::_OnChangedClipRect()");
    }
    if ((((pIVar2->ElemCount == 0) && (1 < in_RDI->Size)) &&
        (iVar1 = memcmp(&in_RDI[8].Data,pIVar2 + -1,0x1c), iVar1 == 0)) &&
       (pIVar2[-1].UserCallback == (ImDrawCallback)0x0)) {
      ImVector<ImDrawCmd>::pop_back(in_RDI);
      return;
    }
    *(ImDrawCmd **)&pIVar2->ClipRect = in_RDI[8].Data;
    iVar1 = in_RDI[9].Capacity;
    (pIVar2->ClipRect).z = (float)in_RDI[9].Size;
    (pIVar2->ClipRect).w = (float)iVar1;
  }
  else {
    AddDrawCmd(this);
  }
  return;
}

Assistant:

void ImDrawList::_OnChangedClipRect()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &_CmdHeader.ClipRect, sizeof(ImVec4)) != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->ClipRect = _CmdHeader.ClipRect;
}